

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O1

wchar_t textui_do_birth(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  keycode_t kVar6;
  uint32_t uVar7;
  ui_event_type uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  level_map_conflict *plVar13;
  textblock *tb;
  size_t sVar14;
  undefined8 uVar15;
  char *pcVar16;
  char *pcVar17;
  menu_conflict *pmVar18;
  command_conflict *pcVar19;
  bool bVar20;
  long lVar21;
  ulong uVar22;
  wchar_t i;
  birth_stage current;
  birth_stage bVar23;
  int iVar24;
  cmd_code cVar25;
  wchar_t wVar26;
  long lVar27;
  ulong n;
  uint uVar28;
  ulong uVar29;
  birth_stage bVar30;
  mouseclick mVar31;
  region orig_area;
  ui_event uVar32;
  keypress kVar33;
  size_t *line_lengths;
  size_t *line_starts;
  char old_history [240];
  birth_stage local_25c;
  size_t local_258;
  size_t *local_248;
  char *local_240;
  size_t *local_238;
  undefined8 local_230;
  uint8_t local_228;
  char local_21d [5];
  size_t local_218 [30];
  region_conflict local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  
  cmdq_push(CMD_BIRTH_INIT);
  cmdq_execute(CTX_BIRTH);
  bVar20 = false;
  local_25c = BIRTH_RESET;
  bVar30 = BIRTH_BACK;
  current = BIRTH_RESET;
  do {
    bVar23 = current;
    switch(current) {
    case BIRTH_RESET:
      cmdq_push(CMD_BIRTH_RESET);
      local_25c = BIRTH_RESET;
      bVar23 = BIRTH_MAP_CHOICE - (uint)quickstart_allowed;
      break;
    case BIRTH_QUICKSTART:
      display_player(L'\0');
      prt("New character based on previous one:",L'\0',L'\0');
      prt("[\'Y\': use as is; \'N\': redo; \'C\': change name/history; \'=\': set birth options]",
          Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xffffffda');
      do {
        kVar33 = inkey();
        uVar29 = kVar33._0_8_ & 0xffffffdf00000000;
        if (uVar29 == 0x4e00000000) {
          cmdq_push(CMD_BIRTH_RESET);
          bVar23 = BIRTH_MAP_CHOICE;
          bVar2 = false;
LAB_001d4e9a:
          bVar3 = false;
        }
        else {
          if (kVar33.code != 0x18) {
            if ((uVar29 == 0x4300000000) && (arg_force_name == false)) {
              bVar2 = false;
              bVar23 = BIRTH_NAME_CHOICE;
            }
            else {
              if (kVar33.code == 0x3d) {
                do_cmd_options_birth();
              }
              else if (uVar29 == 0x5900000000) {
                cmdq_push(CMD_ACCEPT_CHARACTER);
                bVar23 = BIRTH_COMPLETE;
                bVar3 = true;
                bVar2 = false;
                goto LAB_001d4eb9;
              }
              bVar23 = BIRTH_QUICKSTART;
              bVar2 = true;
            }
            goto LAB_001d4e9a;
          }
          bVar3 = false;
          quit((char *)0x0);
          bVar23 = BIRTH_QUICKSTART;
          bVar2 = true;
        }
LAB_001d4eb9:
      } while (bVar2);
      clear_from(L'\x17');
      if (bVar3) {
        bVar20 = true;
      }
      break;
    case BIRTH_MAP_CHOICE:
      Term_clear();
      text_out_hook = text_out_to_screen;
      text_out_indent = L'\x05';
      Term_gotoxy(L'\x05',L'\x01');
      text_out_e(
                "    *    \n  #{light yellow}#{/} {light yellow}#{/}#  \n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n/{light yellow}##{/}{deep light blue}/{/}{yellow}@{/}{deep light blue}\\{/}{light yellow}##{/}\\\n*  {yellow}@{/}{orange}@{/}{yellow}@{/}  *  Welcome to First Age Angband!\n\\{light yellow}##{/}{deep light blue}\\{/}{yellow}@{/}{deep light blue}/{/}{light yellow}##{/}/\n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n  #{light yellow}#{/} {light yellow}#{/}#  \n    *    \n\nThere are different ways of structuring the world\nof FAangband; \'{light green}?{/}\' gives more details."
                );
      text_out_indent = L'\0';
      pmVar18 = menu_new(MN_SKIN_SCROLL,&map_menu_iter);
      local_128.col = 5;
      local_128.row = 0xe;
      local_128.width = 0x46;
      local_128.page_rows = -99;
      current_map_index = L'\xffffffff';
      num_maps = L'\0';
      if (maps != (level_map_conflict *)0x0) {
        num_maps = L'\0';
        plVar13 = maps;
        do {
          if (plVar13 == world) {
            current_map_index = num_maps;
          }
          num_maps = num_maps + L'\x01';
          plVar13 = plVar13->next;
        } while (plVar13 != (level_map_conflict *)0x0);
      }
      lVar27 = (long)num_maps;
      num_maps = (wchar_t)(lVar27 + 1);
      pvVar12 = mem_zalloc((lVar27 + 1) * 0x10);
      wVar26 = num_maps;
      lVar27 = (long)num_maps;
      if (0 < lVar27) {
        lVar21 = 0;
        plVar13 = maps;
        do {
          if (plVar13 == (level_map_conflict *)0x0) {
            *(char **)((long)pvVar12 + lVar21) = "Quit";
            *(char **)((long)pvVar12 + lVar21 + 8) = "Quit FAangband.";
            plVar13 = (level_map_conflict *)0x0;
          }
          else {
            *(char **)((long)pvVar12 + lVar21) = plVar13->name;
            *(char **)((long)pvVar12 + lVar21 + 8) = plVar13->help;
            plVar13 = plVar13->next;
          }
          lVar21 = lVar21 + 0x10;
        } while (lVar27 << 4 != lVar21);
      }
      menu_setpriv(pmVar18,wVar26,pvVar12);
      pmVar18->cmd_keys = "?";
      pmVar18->flags = 8;
      pmVar18->selections = "abcdefghijklmnopqrstuvwxyz";
      pmVar18->browse_hook = map_menu_browser;
      local_128.page_rows = num_maps + L'\x01';
      menu_layout(pmVar18,&local_128);
      if (pmVar18 == (menu_conflict *)0x0) {
        bVar23 = BIRTH_RESET;
      }
      else {
        screen_save();
        region_erase_bordered((region *)&pmVar18->active);
        bVar23 = BIRTH_RESET;
        menu_select(pmVar18,0,true);
        screen_load();
        if (current_map_index != L'\xffffffff') {
          if (current_map_index == num_maps + L'\xffffffff') {
            bVar23 = BIRTH_RESET;
            quit((char *)0x0);
          }
          else {
            cmdq_push(CMD_CHOOSE_MAP);
            pcVar19 = cmdq_peek();
            cmd_set_arg_choice(pcVar19,"choice",pmVar18->cursor);
            bVar23 = BIRTH_RACE_CHOICE;
          }
        }
      }
      pvVar12 = menu_priv(pmVar18);
      mem_free(pvVar12);
      mem_free(pmVar18);
      break;
    case BIRTH_RACE_CHOICE:
    case BIRTH_CLASS_CHOICE:
    case BIRTH_ROLLER_CHOICE:
      Term_clear();
      Term_clear();
      text_out_hook = text_out_to_screen;
      text_out_indent = L'\x02';
      Term_gotoxy(L'\x02',L'\x01');
      text_out_e(
                "{light blue}Please select your character traits from the menus below:{/}\n\nUse the {light green}movement keys{/} to scroll the menu, {light green}Enter{/} to select the current menu item, \'{light green}*{/}\' for a random menu item, \'{light green}@{/}\' to finish the character with random selections, \'{light green}ESC{/}\' to step back through the birth process, \'{light green}={/}\' for the birth options, \'{light green}?{/}\' for help, or \'{light green}Ctrl-X{/}\' to quit."
                );
      text_out_indent = L'\0';
      cVar25 = CMD_CHOOSE_RACE;
      pmVar18 = &race_menu;
      if (BIRTH_RACE_CHOICE < current) {
        menu_refresh(&race_menu,false);
        cVar25 = CMD_CHOOSE_CLASS;
        pmVar18 = &class_menu;
      }
      if (BIRTH_CLASS_CHOICE < current) {
        menu_refresh(&class_menu,false);
        pmVar18 = &roller_menu;
      }
      pvVar12 = menu_priv(pmVar18);
      wVar26 = L'\a';
      do {
        Term_erase(L'\0',wVar26,L'ÿ');
        wVar26 = wVar26 + L'\x01';
      } while (wVar26 != L'\t');
      Term_putstr(L'\x02',L'\a',L'\xffffffff',L'\v',*(char **)((long)pvVar12 + 8));
      pmVar18->cmd_keys = "?=*@\x18";
      do {
        *(birth_stage *)((long)pvVar12 + 0x14) = current;
        uVar32 = menu_select(pmVar18,1,false);
        uVar8 = uVar32.type;
        if ((int)uVar8 < 0x40) {
          if (uVar8 == EVT_KBRD) {
            bVar30 = BIRTH_RESET;
            kVar6 = uVar32.key.code;
            if ((int)kVar6 < 0x3d) {
              if (kVar6 == 0x18) {
                quit((char *)0x0);
                bVar30 = BIRTH_RESET;
              }
              else if ((kVar6 == 0x2a) && (*(char *)((long)pvVar12 + 0x10) == '\x01')) {
                uVar7 = Rand_div(pmVar18->count);
                pmVar18->cursor = uVar7;
                cmdq_push(cVar25);
                pcVar19 = cmdq_peek();
                cmd_set_arg_choice(pcVar19,"choice",pmVar18->cursor);
                menu_refresh(pmVar18,false);
                bVar30 = current + BIRTH_QUICKSTART;
              }
            }
            else if (kVar6 == 0x3d) {
              do_cmd_options_birth();
              bVar30 = current;
            }
            else {
              bVar30 = BIRTH_RESET;
              if (kVar6 == 0x3f) {
                do_cmd_help();
              }
              else if (kVar6 == 0x40) {
                finish_with_random_choices(current);
                bVar30 = BIRTH_FINAL_CONFIRM;
              }
            }
          }
          else {
            bVar30 = BIRTH_BACK;
            if (uVar8 != EVT_ESCAPE) {
LAB_001d48bb:
              bVar30 = BIRTH_RESET;
            }
          }
        }
        else if (uVar8 == EVT_SWITCH) {
          bVar30 = *(birth_stage *)((long)pvVar12 + 0x14);
        }
        else {
          if (uVar8 != EVT_SELECT) goto LAB_001d48bb;
          if (current == BIRTH_ROLLER_CHOICE) {
            if (pmVar18->cursor == 0) {
              point_based_start();
              cmdq_push(CMD_RESET_STATS);
              pcVar19 = cmdq_peek();
              cmd_set_arg_choice(pcVar19,"choice",L'\x01');
              bVar30 = BIRTH_POINTBASED;
            }
            else {
              cmdq_push(CMD_ROLL_STATS);
              bVar30 = BIRTH_ROLLER;
            }
          }
          else {
            cmdq_push(cVar25);
            pcVar19 = cmdq_peek();
            cmd_set_arg_choice(pcVar19,"choice",pmVar18->cursor);
            bVar30 = current + BIRTH_QUICKSTART;
          }
        }
      } while (bVar30 == BIRTH_RESET);
      bVar23 = current + BIRTH_BACK;
      if (bVar30 != BIRTH_BACK) {
        bVar23 = bVar30;
      }
      if (bVar23 == BIRTH_QUICKSTART) {
        bVar23 = BIRTH_RESET;
      }
      break;
    case BIRTH_POINTBASED:
      if (BIRTH_POINTBASED < bVar30) {
        point_based_start();
        cmdq_push(CMD_REFRESH_STATS);
        cmdq_execute(CTX_BIRTH);
      }
      Term_gotoxy(L'N',point_based_command_stat + L'\x02');
      do {
        uVar32 = inkey_ex();
        if (uVar32.type - EVT_KBRD < 2) goto LAB_001d4dd2;
      } while (uVar32.type != EVT_ESCAPE);
      uVar32 = (ui_event)ZEXT812(0xe00000000001);
LAB_001d4dd2:
      uVar29 = uVar32._0_8_;
      uVar10 = uVar32.key.code;
      if (uVar32.type == EVT_MOUSE) {
        iVar11 = 3;
        if ((uVar29 & 0xff000000000000) != 0x2000000000000) {
          uVar28 = uVar10 >> 8 & 0xff;
          if (((uint)(uVar28 + L'\xfffffffe') < 5) && (uVar28 != point_based_command_stat + L'\x02')
             ) {
            iVar11 = 0;
            point_based_command_stat = uVar28 + L'\xfffffffe';
          }
          else {
            pcVar16 = string_make("abcdefghijklmnopqrstuvwxyz");
            pmVar18 = menu_dynamic_new();
            pmVar18->selections = pcVar16;
            if ((uVar28 == point_based_command_stat + L'\x02') &&
               ((*(byte *)(buysell + (uint)point_based_command_stat) & 1) != 0)) {
              menu_dynamic_add_label(pmVar18,"Sell",'s',2,pcVar16);
            }
            if ((uVar28 == point_based_command_stat + L'\x02') &&
               ((*(byte *)(buysell + (uint)point_based_command_stat) & 2) != 0)) {
              menu_dynamic_add_label(pmVar18,"Buy",'b',1,pcVar16);
            }
            menu_dynamic_add_label(pmVar18,"Accept",'a',5,pcVar16);
            menu_dynamic_add_label(pmVar18,"Reset",'r',4,pcVar16);
            menu_dynamic_add_label(pmVar18,"Quit",'q',6,pcVar16);
            screen_save();
            menu_dynamic_calc_location(pmVar18,uVar10 & 0xff,uVar28);
            region_erase_bordered((region *)&pmVar18->boundary);
            iVar11 = menu_dynamic_select(pmVar18);
            menu_dynamic_free(pmVar18);
            string_free(pcVar16);
            screen_load();
          }
        }
      }
      else {
        iVar11 = 0;
        if (uVar32.type == EVT_KBRD) {
          if (uVar29 >> 0x20 == 0x18) {
            iVar11 = 6;
          }
          else if (uVar10 == 0xe000) {
            iVar11 = 3;
          }
          else {
            iVar11 = 4;
            if ((uVar29 & 0xffffffdf00000000) != 0x5200000000) {
              if (uVar10 == 0x9c) {
                iVar11 = 5;
              }
              else {
                if (uVar10 == 0x2d) {
                  wVar26 = L'\x04';
                }
                else if (uVar10 == 0x2b) {
                  wVar26 = L'\x06';
                }
                else {
                  kVar33._8_4_ = uVar32._8_4_ & 0xff;
                  kVar33.type = (int)uVar29;
                  kVar33.code = (int)(uVar29 >> 0x20);
                  wVar26 = target_dir(kVar33);
                }
                iVar11 = 0;
                if (wVar26 == L'\x02') {
                  point_based_command_stat =
                       point_based_command_stat +
                       ((uint)(point_based_command_stat + L'\x01') / 5) * -5 + L'\x01';
                }
                else if (wVar26 == L'\x04') {
                  iVar11 = 2;
                }
                else if (wVar26 == L'\b') {
                  point_based_command_stat =
                       point_based_command_stat +
                       ((uint)(point_based_command_stat + L'\x04') / 5) * -5 + L'\x04';
                }
                if (wVar26 == L'\x06') {
                  iVar11 = 1;
                }
              }
            }
          }
        }
      }
      local_25c = BIRTH_POINTBASED;
      bVar2 = true;
      switch(iVar11) {
      case 1:
        cVar25 = CMD_BUY_STAT;
        goto LAB_001d5b03;
      case 2:
        cVar25 = CMD_SELL_STAT;
LAB_001d5b03:
        cmdq_push(cVar25);
        pcVar19 = cmdq_peek();
        wVar26 = point_based_command_stat;
LAB_001d5b1d:
        cmd_set_arg_choice(pcVar19,"choice",wVar26);
        break;
      case 3:
        bVar23 = BIRTH_ROLLER_CHOICE;
        goto LAB_001d5add;
      case 4:
        cmdq_push(CMD_RESET_STATS);
        pcVar19 = cmdq_peek();
        wVar26 = L'\0';
        goto LAB_001d5b1d;
      case 5:
        bVar23 = BIRTH_NAME_CHOICE;
LAB_001d5add:
        bVar2 = false;
        goto LAB_001d5b30;
      case 6:
        quit((char *)0x0);
      }
      bVar23 = BIRTH_POINTBASED;
LAB_001d5b30:
      if (bVar2) {
        bVar23 = BIRTH_POINTBASED;
      }
      else {
        event_remove_handler(EVENT_BIRTHPOINTS,point_based_points,(void *)0x0);
        event_remove_handler(EVENT_STATS,point_based_stats,(void *)0x0);
        event_remove_handler(EVENT_GOLD,point_based_misc,(void *)0x0);
      }
      break;
    case BIRTH_ROLLER:
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128.col = 0;
      local_128.row = 0;
      local_128.width = 0;
      local_128.page_rows = 0;
      local_218[0] = 0;
      display_player(L'\0');
      if (bVar30 < BIRTH_ROLLER) {
        roller_command_prev_roll = 0;
      }
      strnfcat((char *)&local_128,0x50,local_218,"[\'r\' to reroll");
      if (roller_command_prev_roll == 1) {
        strnfcat((char *)&local_128,0x50,local_218,", \'p\' for previous roll");
      }
      strnfcat((char *)&local_128,0x50,local_218," or \'Enter\' to accept]");
      prt((char *)&local_128,Term->hgt + L'\xffffffff',Term->wid / 2 - (int)(local_218[0] >> 1));
      do {
        uVar32 = inkey_ex();
        mVar31 = uVar32.mouse;
        uVar8 = uVar32.type;
        if (uVar8 - EVT_KBRD < 2) goto LAB_001d5598;
        if (uVar8 == EVT_ESCAPE) {
          mVar31.type = EVT_KBRD;
          mVar31.x = '\0';
          mVar31.y = 0xe0;
          mVar31.button = '\0';
          mVar31.mods = '\0';
          goto LAB_001d5598;
        }
      } while (uVar8 != EVT_BUTTON);
      mVar31 = (mouseclick)(((ulong)mVar31 & 0xffffffff00000000) + 1);
LAB_001d5598:
      uVar10 = mVar31._4_4_;
      if (mVar31.type == EVT_MOUSE) {
        iVar11 = 1;
        if (((ulong)mVar31 & 0xff000000000000) != 0x2000000000000) {
          pcVar16 = string_make("abcdefghijklmnopqrstuvwxyz");
          pmVar18 = menu_dynamic_new();
          pmVar18->selections = pcVar16;
          menu_dynamic_add_label(pmVar18,"Reroll",'r',2,pcVar16);
          if (roller_command_prev_roll == 1) {
            menu_dynamic_add_label(pmVar18,"Retrieve previous",'p',3,pcVar16);
          }
          menu_dynamic_add_label(pmVar18,"Accept",'a',4,pcVar16);
          menu_dynamic_add_label(pmVar18,"Quit",'q',5,pcVar16);
          menu_dynamic_add_label(pmVar18,"Help",'?',6,pcVar16);
          screen_save();
          menu_dynamic_calc_location(pmVar18,uVar10 & 0xff,uVar10 >> 8 & 0xff);
          region_erase_bordered((region *)&pmVar18->boundary);
          iVar11 = menu_dynamic_select(pmVar18);
          menu_dynamic_free(pmVar18);
          string_free(pcVar16);
          screen_load();
        }
      }
      else {
        iVar11 = 0;
        if (mVar31.type == EVT_KBRD) {
          if ((int)uVar10 < 0x9c) {
            if ((uVar10 == 0x20) || (uVar10 == 0x72)) {
              iVar11 = 2;
            }
            else {
LAB_001d595c:
              if ((uVar10 != 0x70) || (iVar11 = 3, (roller_command_prev_roll & 1) == 0)) {
                if (uVar10 == 0x18) {
                  iVar11 = 5;
                }
                else if (uVar10 == 0x3f) {
                  iVar11 = 6;
                }
                else {
                  bell();
                  iVar11 = 0;
                }
              }
            }
          }
          else if (uVar10 == 0xe000) {
            iVar11 = 1;
          }
          else {
            if (uVar10 != 0x9c) goto LAB_001d595c;
            iVar11 = 4;
          }
        }
      }
      local_25c = BIRTH_ROLLER;
      bVar23 = BIRTH_ROLLER;
      switch(iVar11) {
      case 1:
        bVar23 = BIRTH_ROLLER_CHOICE;
        goto switchD_001d4771_default;
      case 2:
        cmdq_push(CMD_ROLL_STATS);
        roller_command_prev_roll = 1;
        break;
      case 3:
        cmdq_push(CMD_PREV_STATS);
        break;
      case 4:
        bVar23 = BIRTH_NAME_CHOICE;
        goto switchD_001d4771_default;
      case 5:
        quit((char *)0x0);
        break;
      case 6:
        do_cmd_help();
        break;
      default:
        goto switchD_001d4771_default;
      }
      bVar23 = BIRTH_ROLLER;
      break;
    case BIRTH_NAME_CHOICE:
      if (bVar30 < BIRTH_NAME_CHOICE) {
        display_player(L'\0');
      }
      if (arg_name[0] != '\0') {
        my_strcpy(player->full_name,arg_name,0x20);
      }
      bVar23 = BIRTH_HISTORY_CHOICE;
      if (((arg_force_name == false) &&
          (_Var5 = get_character_name((char *)&local_128,0x20), bVar23 = local_25c, _Var5)) &&
         ((savefile[0] != '\0' ||
          ((_Var5 = savefile_name_already_used((char *)&local_128,true,true), !_Var5 ||
           (_Var5 = get_check("A savefile for that name exists.  Overwrite it? "), _Var5)))))) {
        cmdq_push(CMD_NAME_CHOICE);
        pcVar19 = cmdq_peek();
        cmd_set_arg_string(pcVar19,"name",(char *)&local_128);
        bVar23 = BIRTH_HISTORY_CHOICE;
      }
      break;
    case BIRTH_HISTORY_CHOICE:
      if (bVar30 < BIRTH_HISTORY_CHOICE) {
        display_player(L'\0');
      }
      my_strcpy((char *)&local_128,player->history,0xf0);
      prt("Accept character history? [y/n]",L'\0',L'\0');
      kVar33 = inkey();
      if (kVar33._0_8_ >> 0x20 == 0xe000) {
        bVar23 = BIRTH_BACK;
      }
      else if (kVar33.code == 0x18) {
        bVar23 = BIRTH_RESET;
        quit((char *)0x0);
      }
      else {
        bVar23 = BIRTH_FINAL_CONFIRM;
        if ((kVar33._0_8_ & 0xffffffdf00000000) == 0x4e00000000) {
          my_strcpy((char *)local_218,player->history,0xf0);
          local_258 = strlen((char *)local_218);
          iVar11 = 0;
          bVar2 = false;
          do {
            bVar3 = bVar2;
            if (bVar3) goto LAB_001d5924;
            tb = textblock_new();
            uVar29 = 0;
            local_238 = (size_t *)0x0;
            local_248 = (size_t *)0x0;
            clear_from(L'\x12');
            textblock_append(tb,"%s",local_218);
            orig_area.width = L'G';
            orig_area.page_rows = L'\x05';
            orig_area.col = L'\x01';
            orig_area.row = L'\x13';
            textui_textblock_place(tb,orig_area,(char *)0x0);
            sVar14 = textblock_calculate_lines(tb,&local_238,&local_248,0x47);
            iVar24 = 0;
            if (sVar14 != 0) {
              iVar24 = (int)local_248[sVar14 - 1] + (int)local_238[sVar14 - 1];
            }
            n = (ulong)iVar11;
            wVar26 = L'\x01';
            if (((sVar14 != 0) && (local_238 != (size_t *)0x0)) && (local_248 != (size_t *)0x0)) {
              uVar22 = 0;
              lVar27 = 0;
              do {
                if ((local_238[uVar22] <= n) && (n <= local_238[uVar22] + local_248[uVar22])) {
                  wVar26 = (iVar11 - (int)lVar27) + L'\x01';
                  uVar29 = uVar22 & 0xffffffff;
                  break;
                }
                lVar27 = lVar27 + local_248[uVar22] + 1;
                uVar22 = uVar22 + 1;
              } while (sVar14 != uVar22);
            }
            iVar1 = (int)uVar29;
            Term_gotoxy(wVar26,iVar1 + L'\x13');
            kVar33 = inkey();
            uVar15 = kVar33._0_8_;
            local_228 = kVar33.mods;
            local_230._4_4_ = kVar33.code;
            kVar6 = local_230._4_4_;
            uVar10 = (uint)local_258;
            local_230 = uVar15;
            iVar9 = iVar11;
            bVar2 = bVar3;
            switch(local_230._4_4_) {
            case 0x94:
              iVar9 = 0;
              break;
            case 0x95:
            case 0x97:
            case 0x98:
            case 0x99:
            case 0x9a:
            case 0x9b:
            case 0x9d:
switchD_001d524d_caseD_95:
              _Var5 = keycode_isprint(kVar6);
              if (_Var5) {
                pcVar16 = (char *)utf32_to_utf8(local_21d,5,(uint32_t *)((long)&local_230 + 4),1,
                                                (size_t *)0x0);
                if (((int)pcVar16 != 0) && (uVar28 = uVar10 + (int)pcVar16, (int)uVar28 < 0xf0)) {
                  if (iVar11 == iVar24) {
                    pcVar17 = (char *)((long)local_218 + (long)(int)uVar10);
                  }
                  else {
                    local_240 = pcVar16;
                    pcVar17 = utf8_fskip((char *)local_218,n,(char *)0x0);
                    pcVar16 = local_240;
                    if (pcVar17 == (char *)0x0) {
                      __assert_fail("ocurs",
                                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                    ,0x6c4,"int edit_text(char *, int)");
                    }
                    memmove(pcVar17 + (int)local_240,pcVar17,
                            (long)local_218 + ((long)(int)uVar10 - (long)pcVar17));
                  }
                  memcpy(pcVar17,local_21d,(long)(int)pcVar16);
                  iVar11 = iVar11 + 1;
                  *(undefined1 *)((long)local_218 + (long)(int)uVar28) = 0;
                  uVar10 = uVar28;
                }
              }
              local_258 = (size_t)uVar10;
              uVar15 = local_230;
              iVar9 = iVar11;
              break;
            case 0x96:
              iVar9 = iVar24;
              if (iVar24 < 1) {
                iVar9 = 0;
              }
              break;
            case 0x9c:
              bVar2 = true;
              break;
            case 0x9e:
            case 0x9f:
              if (((local_230._4_4_ != 0x9f) || (iVar11 != 0)) &&
                 ((local_230._4_4_ != 0x9e || (iVar11 < iVar24)))) {
                pcVar16 = utf8_fskip((char *)local_218,n,(char *)0x0);
                if (pcVar16 == (char *)0x0) {
                  __assert_fail("ocurs",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                ,0x691,"int edit_text(char *, int)");
                }
                if (local_230._4_4_ == 0x9f) {
                  pcVar17 = utf8_rskip(pcVar16,1,(char *)local_218);
                  if (pcVar17 == (char *)0x0) {
                    __assert_fail("oshift",
                                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                  ,0x695,"int edit_text(char *, int)");
                  }
                  local_240 = pcVar16;
                  memmove(pcVar17,pcVar16,(long)local_218 + ((long)(int)uVar10 - (long)pcVar16));
                  iVar11 = iVar11 + -1;
                  pcVar16 = pcVar17;
                }
                else {
                  pcVar17 = utf8_fskip(pcVar16,1,(char *)0x0);
                  if (pcVar17 == (char *)0x0) {
                    __assert_fail("oshift",
                                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                  ,0x69e,"int edit_text(char *, int)");
                  }
                  local_240 = pcVar17;
                  memmove(pcVar16,pcVar17,(long)local_218 + ((long)(int)uVar10 - (long)pcVar17));
                }
                uVar10 = uVar10 + ((int)pcVar16 - (int)local_240);
                local_258 = (size_t)uVar10;
                *(undefined1 *)((long)local_218 + (long)(int)uVar10) = 0;
                uVar15 = local_230;
                iVar9 = iVar11;
              }
              break;
            default:
              switch(local_230._4_4_) {
              case 0x80:
                iVar11 = (int)local_248[iVar1] + iVar11 + 1;
                if (iVar11 < iVar24) {
                  iVar9 = iVar11;
                }
                break;
              case 0x81:
                iVar9 = iVar11 - (uint)(0 < iVar11);
                break;
              case 0x82:
                iVar9 = iVar11 + (uint)(iVar11 < iVar24);
                break;
              case 0x83:
                if ((0 < iVar1) && (iVar9 = ~(uint)local_248[uVar29 - 1] + iVar11, iVar9 < 0)) {
                  iVar9 = iVar11;
                }
                break;
              default:
                if (local_230._4_4_ != 0xe000) goto switchD_001d524d_caseD_95;
                bVar4 = false;
                goto LAB_001d53bd;
              }
            }
            local_230 = uVar15;
            mem_free(local_238);
            mem_free(local_248);
            textblock_free(tb);
            bVar4 = true;
            iVar11 = iVar9;
LAB_001d53bd:
          } while (bVar4);
          bVar23 = BIRTH_BACK;
          if (bVar3) {
LAB_001d5924:
            cmdq_push(CMD_HISTORY_CHOICE);
            pcVar19 = cmdq_peek();
            cmd_set_arg_string(pcVar19,"history",(char *)local_218);
            bVar23 = BIRTH_HISTORY_CHOICE;
          }
        }
      }
      if (bVar23 == BIRTH_BACK) {
        bVar23 = BIRTH_NAME_CHOICE;
      }
      break;
    case BIRTH_FINAL_CONFIRM:
      if (bVar30 < BIRTH_FINAL_CONFIRM) {
        display_player(L'\0');
      }
      prt("[\'ESC\' to step back, \'S\' to start over, or any other key to continue]",
          Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xffffffde');
      kVar33 = inkey();
      bVar23 = BIRTH_RESET;
      if ((kVar33._0_8_ & 0xffffffdf00000000) != 0x5300000000) {
        if (kVar33._0_8_ >> 0x20 == 0xe000) {
          bVar23 = BIRTH_HISTORY_CHOICE;
        }
        else if (kVar33.code == 0x18) {
          bVar23 = BIRTH_RESET;
          quit((char *)0x0);
        }
        else {
          cmdq_push(CMD_ACCEPT_CHARACTER);
          bVar23 = BIRTH_COMPLETE;
          bVar20 = true;
        }
      }
      clear_from(L'\x17');
    }
switchD_001d4771_default:
    cmdq_execute(CTX_BIRTH);
    bVar30 = current;
    current = bVar23;
    if (bVar20) {
      return L'\0';
    }
  } while( true );
}

Assistant:

int textui_do_birth(void)
{
	enum birth_stage current_stage = BIRTH_RESET;
	enum birth_stage prev = BIRTH_BACK;
	enum birth_stage roller = BIRTH_RESET;
	enum birth_stage next = current_stage;

	bool done = false;

	cmdq_push(CMD_BIRTH_INIT);
	cmdq_execute(CTX_BIRTH);

	while (!done) {

		switch (current_stage)
		{
			case BIRTH_RESET:
			{
				cmdq_push(CMD_BIRTH_RESET);

				roller = BIRTH_RESET;
				
				if (quickstart_allowed)
					next = BIRTH_QUICKSTART;
				else
					next = BIRTH_MAP_CHOICE;

				break;
			}

			case BIRTH_QUICKSTART:
			{
				display_player(0);
				next = textui_birth_quickstart();
				if (next == BIRTH_COMPLETE)
					done = true;
				break;
			}

			case BIRTH_MAP_CHOICE:
			{
				print_map_instructions();
				next = get_map_command();
				if (next == BIRTH_BACK)
					next = BIRTH_RESET;
				break;
			}

			case BIRTH_CLASS_CHOICE:
			case BIRTH_RACE_CHOICE:
			case BIRTH_ROLLER_CHOICE:
			{
				struct menu *menu = &race_menu;
				cmd_code command = CMD_CHOOSE_RACE;

				Term_clear();
				print_menu_instructions();

				if (current_stage > BIRTH_RACE_CHOICE) {
					menu_refresh(&race_menu, false);
					menu = &class_menu;
					command = CMD_CHOOSE_CLASS;
				}

				if (current_stage > BIRTH_CLASS_CHOICE) {
					menu_refresh(&class_menu, false);
					menu = &roller_menu;
				}

				next = menu_question(current_stage, menu, command);

				if (next == BIRTH_BACK)
					next = current_stage - 1;

				/* Make sure the character gets reset before quickstarting */
				if (next == BIRTH_QUICKSTART) 
					next = BIRTH_RESET;

				break;
			}

			case BIRTH_POINTBASED:
			{
				roller = BIRTH_POINTBASED;
		
				if (prev > BIRTH_POINTBASED) {
					point_based_start();
					/*
					 * Force a redraw of the point
					 * allocations but do not reset them.
					 */
					cmdq_push(CMD_REFRESH_STATS);
					cmdq_execute(CTX_BIRTH);
				}

				next = point_based_command();

				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				if (next != BIRTH_POINTBASED)
					point_based_stop();

				break;
			}

			case BIRTH_ROLLER:
			{
				roller = BIRTH_ROLLER;
				next = roller_command(prev < BIRTH_ROLLER);
				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				break;
			}

			case BIRTH_NAME_CHOICE:
			{
				if (prev < BIRTH_NAME_CHOICE)
					display_player(0);

				next = get_name_command();
				if (next == BIRTH_BACK)
					next = roller;

				break;
			}

			case BIRTH_HISTORY_CHOICE:
			{
				if (prev < BIRTH_HISTORY_CHOICE)
					display_player(0);

				next = get_history_command();
				if (next == BIRTH_BACK)
					next = BIRTH_NAME_CHOICE;

				break;
			}

			case BIRTH_FINAL_CONFIRM:
			{
				if (prev < BIRTH_FINAL_CONFIRM)
					display_player(0);

				next = get_confirm_command();
				if (next == BIRTH_BACK)
					next = BIRTH_HISTORY_CHOICE;

				if (next == BIRTH_COMPLETE)
					done = true;

				break;
			}

			default:
			{
				/* Remove dodgy compiler warning, */
			}
		}

		prev = current_stage;
		current_stage = next;

		/* Execute whatever commands have been sent */
		cmdq_execute(CTX_BIRTH);
	}

	return 0;
}